

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
          (BasicResult<Catch::clara::detail::ParseResultType> *this,
          BasicResult<Catch::clara::detail::ParseResultType> *param_1)

{
  Type TVar1;
  
  TVar1 = (param_1->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
          m_type;
  (this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.m_type =
       TVar1;
  (this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001afa38;
  if (TVar1 == Ok) {
    *(undefined4 *)
     &(this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
      field_0xc = *(undefined4 *)
                   &(param_1->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
                    super_ResultBase.field_0xc;
  }
  (this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001af9e0;
  ::std::__cxx11::string::string((string *)&this->m_errorMessage,(string *)&param_1->m_errorMessage)
  ;
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }